

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O0

void __thiscall Centaurus::Stream::~Stream(Stream *this)

{
  Stream *this_local;
  
  ~Stream(this);
  operator_delete(this);
  return;
}

Assistant:

void skip_multiline_comment()
    {
        wchar_t ch = get();
        for (; ch != L'\0'; ch = get())
        {
            if (ch == L'*')
            {
                ch = peek();
                if (ch == L'/')
                {
                    get();
                    return;
                }
            }
        }
        throw unexpected(EOF);
    }